

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

size_t duckdb_brotli::BrotliEncoderEstimatePeakMemoryUsage(int quality,int lgwin,size_t input_size)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  BrotliEncoderParams BStack_5a8;
  
  BrotliEncoderInitParams(&BStack_5a8);
  uVar4 = 0;
  if (0 < quality) {
    uVar4 = quality;
  }
  uVar2 = 0xb;
  if ((int)uVar4 < 0xb) {
    uVar2 = uVar4;
  }
  uVar4 = 0x18;
  uVar8 = 0x1e;
  if (lgwin < 0x19) {
    uVar8 = uVar4;
  }
  if (quality < 3) {
    uVar8 = uVar4;
  }
  if ((uint)lgwin <= uVar8) {
    uVar8 = lgwin;
  }
  uVar11 = 10;
  if (lgwin < 10) {
    uVar8 = uVar11;
  }
  uVar5 = uVar8;
  if (quality < 2) {
LAB_0033aa1d:
    if (quality == 4) {
      if (input_size < 0x100000) goto LAB_0033aa3d;
      BStack_5a8.hasher.type = 0x36;
      uVar11 = 0x36;
LAB_0033aa35:
      bVar1 = false;
      goto LAB_0033aa46;
    }
    if (quality < 5) {
LAB_0033aa3d:
      BStack_5a8.hasher.type = uVar2;
      bVar1 = false;
      uVar11 = uVar2;
      goto LAB_0033aa46;
    }
    if (0x10 < uVar8) {
      BStack_5a8.hasher.block_bits = uVar2 - 1;
      if ((input_size < 0x100000) || (uVar8 < 0x13)) {
        BStack_5a8.hasher.bucket_bits = 0xf - (uint)((uint)quality < 7);
        BStack_5a8.hasher.type = 5;
        uVar11 = 5;
      }
      else {
        BStack_5a8.hasher.type = 6;
        BStack_5a8.hasher.bucket_bits = 0xf;
        uVar11 = 6;
      }
      goto LAB_0033aa35;
    }
    uVar11 = 0x28;
    if (6 < (uint)quality) {
      uVar11 = 0x2a - ((uint)quality < 9);
    }
    BStack_5a8.hasher._0_8_ = (ulong)(uint)BStack_5a8.hasher.bucket_bits << 0x20;
    bVar1 = false;
  }
  else {
    if ((uint)quality < 4) {
      uVar5 = 0xe;
      goto LAB_0033aa1d;
    }
    uVar5 = 0x10;
    if (BStack_5a8.lgblock == 0) {
      if ((uint)quality < 9) goto LAB_0033aa1d;
      if ((0x10 < uVar8) && (uVar5 = 0x12, uVar8 < 0x12)) {
        uVar5 = uVar8;
      }
    }
    else {
      if (0x10 < BStack_5a8.lgblock) {
        uVar5 = BStack_5a8.lgblock;
      }
      if (0x17 < (int)uVar5) {
        uVar5 = uVar4;
      }
    }
    bVar1 = true;
    if ((uint)quality < 10) goto LAB_0033aa1d;
LAB_0033aa46:
    if (0x18 < uVar8) {
      if (uVar11 == 3) {
        uVar11 = 0x23;
      }
      else if (uVar11 == 6) {
        uVar11 = 0x41;
      }
      else {
        if (uVar11 != 0x36) goto LAB_0033aac2;
        uVar11 = 0x37;
      }
      BStack_5a8.hasher.type = uVar11;
    }
LAB_0033aac2:
    if (quality < 2) {
      uVar13 = 1L << ((byte)uVar8 & 0x3f);
      if (input_size < uVar13) {
        uVar13 = input_size;
      }
      sVar10 = 0x8000;
      if (quality == 1) {
        sVar10 = 0x20000;
      }
      sVar10 = HashTableSize(sVar10,uVar13);
      lVar7 = 0;
      lVar9 = sVar10 * 4;
      if (sVar10 < 0x400) {
        lVar9 = lVar7;
      }
      lVar6 = 0x3b10;
      if (quality == 1) {
        sVar10 = 0x20000;
        if (uVar13 < 0x20000) {
          sVar10 = uVar13;
        }
        lVar7 = sVar10 * 5;
        lVar6 = 0x3908;
      }
      return lVar9 + lVar6 + lVar7;
    }
  }
  uVar13 = 1L << ((byte)uVar5 & 0x3f);
  if (uVar5 < uVar8) {
    uVar5 = uVar8;
  }
  sVar10 = (uint)(2 << ((byte)uVar5 & 0x1f)) + uVar13;
  if (input_size < uVar13) {
    sVar10 = input_size;
  }
  uVar4 = 0x17;
  if (uVar5 < 0x17) {
    uVar4 = uVar5;
  }
  uVar3 = 1L << ((char)uVar4 + 1U & 0x3f);
  if (input_size < uVar3) {
    uVar3 = input_size;
  }
  if (input_size < uVar13) {
    uVar13 = input_size;
  }
  lVar9 = 0;
  lVar6 = 0;
  lVar7 = 0;
  switch(uVar11) {
  case 2:
  case 3:
    lVar9 = 0x40000;
    goto LAB_0033aca9;
  case 4:
    lVar9 = 0x80000;
LAB_0033aca9:
    lVar6 = 0;
LAB_0033acac:
    lVar7 = 0;
    break;
  case 5:
  case 6:
    lVar9 = 2L << ((byte)BStack_5a8.hasher.bucket_bits & 0x3f);
    lVar6 = (4L << ((byte)BStack_5a8.hasher.bucket_bits & 0x3f)) <<
            ((byte)BStack_5a8.hasher.block_bits & 0x3f);
    goto LAB_0033acac;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    uVar12 = 1L << ((byte)uVar8 & 0x3f);
    if (input_size <= uVar12) {
      uVar12 = input_size;
    }
    lVar6 = uVar12 << 3;
    lVar9 = 0x80000;
    lVar7 = 0;
    break;
  default:
    lVar6 = 0;
    lVar7 = 0;
    switch(uVar11) {
    case 0x23:
      lVar9 = 0x40000;
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      goto switchD_0033ab9b_caseD_24;
    case 0x28:
    case 0x29:
      lVar9 = 0x40000;
      lVar7 = 0;
      lVar6 = 0x40000;
      goto switchD_0033ab9b_caseD_24;
    case 0x2a:
      lVar6 = 0x100000;
      lVar9 = 0x40000;
      goto LAB_0033acac;
    default:
      if (uVar11 == 0x36) {
        lVar9 = 0x400000;
        goto LAB_0033aca9;
      }
      if (uVar11 != 0x37) {
        lVar6 = 0;
        lVar7 = 0;
        if (uVar11 == 0x41) {
          lVar9 = 2L << ((byte)BStack_5a8.hasher.bucket_bits & 0x3f);
          lVar6 = (4L << ((byte)BStack_5a8.hasher.bucket_bits & 0x3f)) <<
                  ((byte)BStack_5a8.hasher.block_bits & 0x3f);
          lVar7 = 0x4000000;
        }
        goto switchD_0033ab9b_caseD_24;
      }
      lVar9 = 0x400000;
    }
    lVar7 = 0x4000000;
    lVar6 = 0;
  }
switchD_0033ab9b_caseD_24:
  uVar12 = uVar13 * 6 + uVar3 * 2;
  if (((uint)quality < 4) && (uVar13 = uVar13 * 0xc + 0x2fff0, uVar13 <= uVar12)) {
    uVar12 = uVar13;
  }
  uVar13 = 0xc800000;
  if (!bVar1) {
    if ((uint)quality < 4) {
      uVar13 = 0;
    }
    else {
      uVar2 = (uint)((uVar3 & 0xffffffff) / 0x1800);
      uVar4 = 0x100;
      if (uVar2 < 0x100) {
        uVar4 = uVar2;
      }
      uVar13 = (ulong)(uVar4 * 0x17b0);
    }
  }
  return uVar13 + lVar9 + lVar6 + lVar7 + uVar12 + sVar10 + uVar3 * 2 + 0x1f7;
}

Assistant:

size_t  duckdb_brotli::BrotliEncoderEstimatePeakMemoryUsage(int quality, int lgwin,
                                            size_t input_size) {
  BrotliEncoderParams params;
  size_t memory_manager_slots = BROTLI_ENCODER_MEMORY_MANAGER_SLOTS;
  size_t memory_manager_size = memory_manager_slots * sizeof(void*);
  BrotliEncoderInitParams(&params);
  params.quality = quality;
  params.lgwin = lgwin;
  params.size_hint = input_size;
  params.large_window = lgwin > BROTLI_MAX_WINDOW_BITS;
  SanitizeParams(&params);
  params.lgblock = ComputeLgBlock(&params);
  ChooseHasher(&params, &params.hasher);
  if (params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    size_t state_size = sizeof(BrotliEncoderState);
    size_t block_size = BROTLI_MIN(size_t, input_size, (1ul << params.lgwin));
    size_t hash_table_size =
        HashTableSize(MaxHashTableSize(params.quality), block_size);
    size_t hash_size =
        (hash_table_size < (1u << 10)) ? 0 : sizeof(int) * hash_table_size;
    size_t cmdbuf_size = params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY ?
        5 * BROTLI_MIN(size_t, block_size, 1ul << 17) : 0;
    if (params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      state_size += sizeof(BrotliOnePassArena);
    } else {
      state_size += sizeof(BrotliTwoPassArena);
    }
    return hash_size + cmdbuf_size + state_size;
  } else {
    size_t short_ringbuffer_size = (size_t)1 << params.lgblock;
    int ringbuffer_bits = ComputeRbBits(&params);
    size_t ringbuffer_size = input_size < short_ringbuffer_size ?
        input_size : (1u << ringbuffer_bits) + short_ringbuffer_size;
    size_t hash_size[4] = {0};
    size_t metablock_size =
        BROTLI_MIN(size_t, input_size, MaxMetablockSize(&params));
    size_t inputblock_size =
        BROTLI_MIN(size_t, input_size, (size_t)1 << params.lgblock);
    size_t cmdbuf_size = metablock_size * 2 + inputblock_size * 6;
    size_t outbuf_size = metablock_size * 2 + 503;
    size_t histogram_size = 0;
    HasherSize(&params, BROTLI_TRUE, input_size, hash_size);
    if (params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT) {
      cmdbuf_size = BROTLI_MIN(size_t, cmdbuf_size,
          MAX_NUM_DELAYED_SYMBOLS * sizeof(Command) + inputblock_size * 12);
    }
    if (params.quality >= MIN_QUALITY_FOR_HQ_BLOCK_SPLITTING) {
      /* Only a very rough estimation, based on enwik8. */
      histogram_size = 200 << 20;
    } else if (params.quality >= MIN_QUALITY_FOR_BLOCK_SPLIT) {
      size_t literal_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      size_t command_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      size_t distance_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      histogram_size = literal_histograms * sizeof(HistogramLiteral) +
                       command_histograms * sizeof(HistogramCommand) +
                       distance_histograms * sizeof(HistogramDistance);
    }
    return (memory_manager_size + ringbuffer_size +
            hash_size[0] + hash_size[1] + hash_size[2] + hash_size[3] +
            cmdbuf_size +
            outbuf_size +
            histogram_size);
  }
}